

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

string * cmQtAutoGeneratorsStripCR(string *__return_storage_ptr__,string *line)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find((char)line,0xd);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)line);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmQtAutoGeneratorsStripCR(std::string const& line)
{
  // Strip CR characters rcc may have printed (possibly more than one!).
  std::string::size_type cr = line.find('\r');
  if (cr != line.npos)
    {
    return line.substr(0, cr);
    }
  return line;
}